

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_ntop.c
# Opt level: O0

int sock_pton_with_prefix(char *cp,sockaddr *sa,int *int_prefix)

{
  sockaddr *__src;
  FILE *__stream;
  int iVar1;
  ushort **ppuVar2;
  char *pcVar3;
  char *pcVar4;
  size_t __n;
  bool bVar5;
  addrinfo *paStack_90;
  int rv;
  addrinfo *p;
  addrinfo *servinfo;
  addrinfo hints;
  char *port;
  char *host_name;
  char *ip_end;
  char *prefix;
  char *prefix_begin;
  int *int_prefix_local;
  sockaddr *sa_local;
  char *cp_local;
  
  prefix = (char *)0x0;
  hints.ai_next = (addrinfo *)0x0;
  if (((cp == (char *)0x0) || (sa == (sockaddr *)0x0)) ||
     (sa_local = (sockaddr *)cp, int_prefix == (int *)0x0)) {
    cp_local._4_4_ = -1;
  }
  else {
    while( true ) {
      bVar5 = false;
      if (sa_local != (sockaddr *)0x0) {
        ppuVar2 = __ctype_b_loc();
        bVar5 = ((*ppuVar2)[(int)(char)sa_local->sa_family] & 0x2000) != 0;
      }
      if (!bVar5) break;
      sa_local = (sockaddr *)((long)&sa_local->sa_family + 1);
    }
    host_name = (char *)sa_local;
    if ((char)sa_local->sa_family == '[') {
      pcVar4 = (char *)((long)&sa_local->sa_family + 1);
      while( true ) {
        bVar5 = false;
        if (*host_name != '\0') {
          bVar5 = *host_name != ']';
        }
        if (!bVar5) break;
        if (*host_name == '/') {
          prefix = host_name + 1;
        }
        host_name = host_name + 1;
      }
      if (*host_name == '\0') {
        cp_local._4_4_ = -2;
      }
      else {
        if (prefix == (char *)0x0) {
          port = pcp_strndup(pcVar4,(long)host_name - (long)pcVar4);
          *int_prefix = 0x80;
        }
        else {
          port = pcp_strndup(pcVar4,(size_t)(prefix + (-1 - (long)pcVar4)));
          pcVar3 = pcp_strndup(prefix,(long)host_name - (long)prefix);
          if (pcVar3 != (char *)0x0) {
            iVar1 = atoi(pcVar3);
            *int_prefix = iVar1;
            free(pcVar3);
          }
        }
        do {
          while( true ) {
            do {
              pcVar3 = host_name;
              host_name = pcVar3 + 1;
              if (*host_name == '\0') goto LAB_0010b392;
            } while (*host_name != ':');
            if (hints.ai_next != (addrinfo *)0x0) break;
            hints.ai_next = (addrinfo *)(pcVar3 + 2);
          }
        } while (port != (char *)0x0);
        hints.ai_next = (addrinfo *)0x0;
        port = strdup(pcVar4);
LAB_0010b392:
        if (port == (char *)0x0) {
          if ((*host_name == '\0') && (hints.ai_next != (addrinfo *)0x0)) {
            if (1 < (long)hints.ai_next - (long)pcVar4) {
              port = pcp_strndup(pcVar4,(long)hints.ai_next + (-1 - (long)pcVar4));
            }
          }
          else {
            port = pcp_strndup(pcVar4,(long)host_name - (long)pcVar4);
          }
        }
        memset(&servinfo,0,0x30);
        servinfo._4_4_ = 0;
        hints.ai_flags = 2;
        servinfo._0_4_ = 8;
        iVar1 = getaddrinfo(port,(char *)hints.ai_next,(addrinfo *)&servinfo,(addrinfo **)&p);
        __stream = _stderr;
        if (iVar1 == 0) {
          for (paStack_90 = p; paStack_90 != (addrinfo *)0x0; paStack_90 = paStack_90->ai_next) {
            if ((paStack_90->ai_family == 2) || (paStack_90->ai_family == 10)) {
              __src = paStack_90->ai_addr;
              __n = get_sa_len(paStack_90->ai_addr);
              memcpy(sa,__src,__n);
              if (port == (char *)0x0) {
                if (paStack_90->ai_family != 10) {
                  return -2;
                }
                memset(sa->sa_data + 6,0,0x1c);
              }
              break;
            }
          }
          freeaddrinfo((addrinfo *)p);
          if (port != (char *)0x0) {
            free(port);
          }
          if ((sa->sa_family == 2) && (0x20 < *int_prefix)) {
            cp_local._4_4_ = -2;
          }
          else if ((sa->sa_family == 10) && (0x80 < *int_prefix)) {
            cp_local._4_4_ = -2;
          }
          else {
            cp_local._4_4_ = 0;
          }
        }
        else {
          pcVar4 = gai_strerror(iVar1);
          fprintf(__stream,"getaddrinfo: %s\n",pcVar4);
          if (port != (char *)0x0) {
            free(port);
          }
          cp_local._4_4_ = -2;
        }
      }
    }
    else {
      cp_local._4_4_ = -2;
    }
  }
  return cp_local._4_4_;
}

Assistant:

int sock_pton_with_prefix(const char *cp, struct sockaddr *sa,
                          int *int_prefix) {
    const char *prefix_begin = NULL;
    char *prefix = NULL;

    const char *ip_end;
    char *host_name = NULL;
    const char *port = NULL;

    if ((!cp) || (!sa) || (!int_prefix)) {
        return -1;
    }

    // skip ws
    while ((cp) && (isspace(*cp))) {
        ++cp;
    }

    ip_end = cp;
    if (*cp == '[') { // find matching bracket ']'
        ++cp;
        while ((*ip_end) && (*ip_end != ']')) {
            if (*ip_end == '/') {
                prefix_begin = ip_end + 1;
            }
            ++ip_end;
        }

        if (!*ip_end) {
            return -2;
        }

        if (prefix_begin) {
            host_name = strndup(cp, prefix_begin - cp - 1);
            prefix = strndup(prefix_begin, ip_end - prefix_begin);
            if (prefix) {
                *int_prefix = atoi(prefix);
                free(prefix);
            }
        } else {
            host_name = strndup(cp, ip_end - cp);
            *int_prefix = 128;
        }
        ++ip_end;
    } else {
        return -2;
    }

    { // find start of port part
        while (*ip_end) {
            if (*ip_end == ':') {
                if (!port) {
                    port = ip_end + 1;
                } else if (host_name == NULL) { // means addr has [] block
                    port = NULL; // more than 1 ":" => assume the whole addr is
                                 // IPv6 address w/o port
                    host_name = strdup(cp);
                    break;
                }
            }
            ++ip_end;
        }
        if (!host_name) {
            if ((*ip_end == 0) && (port != NULL)) {
                if (port - cp > 1) { // only port entered
                    host_name = strndup(cp, port - cp - 1);
                }
            } else {
                host_name = strndup(cp, ip_end - cp);
            }
        }
    }

    // getaddrinfo for host
    {
        struct addrinfo hints, *servinfo, *p;
        int rv;

        memset(&hints, 0, sizeof hints);
        hints.ai_family = AF_UNSPEC;
        hints.ai_socktype = SOCK_DGRAM;
        hints.ai_flags = AI_V4MAPPED;

        if ((rv = getaddrinfo(host_name, port, &hints, &servinfo)) != 0) {
            fprintf(stderr, "getaddrinfo: %s\n", gai_strerror(rv));
            if (host_name)
                free(host_name);
            return -2;
        }

        for (p = servinfo; p != NULL; p = p->ai_next) {
            if ((p->ai_family == AF_INET) || (p->ai_family == AF_INET6)) {
                memcpy(sa, p->ai_addr, SA_LEN(p->ai_addr));
                if (host_name == NULL) { // getaddrinfo returns localhost ip if
                                         // hostname is null
                    switch (p->ai_family) {
                    case AF_INET6:
                        memset(&((struct sockaddr_in6 *)sa)->sin6_addr, 0,
                               sizeof(struct sockaddr_in6));
                        break;
                    default: // Should never happen LCOV_EXCL_START
                        if (host_name)
                            free(host_name);
                        return -2;
                    } // LCOV_EXCL_STOP
                }
                break;
            }
        }
        freeaddrinfo(servinfo);
    }

    if (host_name)
        free(host_name);

    if ((sa->sa_family == AF_INET) && (*int_prefix > 32)) {

        return -2;
    }

    if ((sa->sa_family == AF_INET6) && (*int_prefix > 128)) {

        return -2;
    }

    return 0;
}